

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O3

wchar_t context_menu_object(object *obj)

{
  byte bVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  _Bool _Var2;
  uchar uVar3;
  _Bool _Var4;
  cmd_code cVar5;
  menu *m;
  char *pcVar6;
  square *psVar7;
  size_t sVar8;
  textblock *ptVar9;
  command_conflict *pcVar10;
  int iVar11;
  menu_row_validity_t mVar12;
  char *pcVar13;
  wchar_t mode;
  region r;
  char header [120];
  region_conflict local_b8;
  char local_a8 [120];
  
  _Var4 = (player->opts).opt[1];
  mode = (wchar_t)_Var4;
  m = menu_dynamic_new();
  if (obj == (object *)0x0 || m == (menu *)0x0) {
    return L'\0';
  }
  object_desc(local_a8,0x78,obj,0x40,player);
  pcVar6 = string_make("abcdefghijklmnopqrstuvwxyz");
  m->selections = pcVar6;
  menu_dynamic_add_label(m,"Inspect",'I',0x45a,pcVar6);
  _Var2 = obj_can_browse(obj);
  if (_Var2) {
    _Var2 = obj_can_cast_from(obj);
    if ((_Var2) && (_Var2 = player_can_cast(player,false), _Var2)) {
      uVar3 = cmd_lookup_key_unktrl(CMD_CAST,mode);
      menu_dynamic_add_label_valid(m,"Cast",uVar3,0x1d,pcVar6,MN_ROW_VALID);
    }
    _Var2 = obj_can_study(obj);
    if ((_Var2) && (_Var2 = player_can_study(player,false), _Var2)) {
      uVar3 = cmd_lookup_key_unktrl(CMD_STUDY,mode);
      menu_dynamic_add_label_valid(m,"Study",uVar3,0x1c,pcVar6,MN_ROW_VALID);
    }
    _Var2 = player_can_read(player,false);
    if (_Var2) {
      uVar3 = cmd_lookup_key_unktrl(CMD_BROWSE_SPELL,mode);
      pcVar13 = "Browse";
      iVar11 = 0x1b;
      goto LAB_001be485;
    }
  }
  else {
    _Var2 = obj_is_useable(obj);
    if (_Var2) {
      _Var2 = tval_is_wand(obj);
      if (_Var2) {
        _Var2 = obj_has_charges(obj);
        mVar12 = (menu_row_validity_t)_Var2;
        uVar3 = cmd_lookup_key_unktrl(CMD_USE_WAND,mode);
        pcVar13 = "Aim";
        iVar11 = 0x1f;
      }
      else {
        _Var2 = tval_is_rod(obj);
        if (_Var2) {
          _Var2 = obj_can_zap(obj);
          mVar12 = (menu_row_validity_t)_Var2;
          uVar3 = cmd_lookup_key_unktrl(CMD_USE_ROD,mode);
          pcVar13 = "Zap";
          iVar11 = 0x20;
        }
        else {
          _Var2 = tval_is_staff(obj);
          if (_Var2) {
            _Var2 = obj_has_charges(obj);
            mVar12 = (menu_row_validity_t)_Var2;
            uVar3 = cmd_lookup_key_unktrl(CMD_USE_STAFF,mode);
            pcVar13 = "Use";
            iVar11 = 0x1e;
          }
          else {
            _Var2 = tval_is_scroll(obj);
            if (_Var2) {
              _Var2 = player_can_read(player,false);
              mVar12 = (menu_row_validity_t)_Var2;
              uVar3 = cmd_lookup_key_unktrl(CMD_READ_SCROLL,mode);
              pcVar13 = "Read";
              iVar11 = 0x24;
            }
            else {
              _Var2 = tval_is_potion(obj);
              if (_Var2) {
                uVar3 = cmd_lookup_key_unktrl(CMD_QUAFF,mode);
                pcVar13 = "Quaff";
                iVar11 = 0x23;
              }
              else {
                _Var2 = tval_is_edible(obj);
                if (_Var2) {
                  uVar3 = cmd_lookup_key_unktrl(CMD_EAT,mode);
                  pcVar13 = "Eat";
                  iVar11 = 0x22;
                }
                else {
                  _Var2 = obj_is_activatable(obj);
                  if (_Var2) {
                    _Var2 = object_is_equipped(player->body,obj);
                    mVar12 = MN_ROW_INVALID;
                    if (_Var2) {
                      _Var2 = obj_can_activate(obj);
                      mVar12 = (menu_row_validity_t)_Var2;
                    }
                    uVar3 = cmd_lookup_key_unktrl(CMD_ACTIVATE,mode);
                    pcVar13 = "Activate";
                    iVar11 = 0x21;
                    goto LAB_001be584;
                  }
                  _Var2 = obj_can_fire(obj);
                  if (_Var2) {
                    uVar3 = cmd_lookup_key_unktrl(CMD_FIRE,mode);
                    pcVar13 = "Fire";
                    iVar11 = 0x27;
                  }
                  else {
                    uVar3 = cmd_lookup_key_unktrl(CMD_USE,mode);
                    pcVar13 = "Use";
                    iVar11 = 0x26;
                  }
                }
              }
LAB_001be485:
              mVar12 = MN_ROW_VALID;
            }
          }
        }
      }
LAB_001be584:
      menu_dynamic_add_label_valid(m,pcVar13,uVar3,iVar11,pcVar6,mVar12);
    }
  }
  _Var2 = obj_can_refill(obj);
  if (_Var2) {
    uVar3 = cmd_lookup_key_unktrl(CMD_REFILL,mode);
    menu_dynamic_add_label_valid(m,"Refill",uVar3,0x25,pcVar6,MN_ROW_VALID);
  }
  _Var2 = object_is_equipped(player->body,obj);
  if ((_Var2) && (_Var2 = obj_can_takeoff(obj), _Var2)) {
    uVar3 = cmd_lookup_key_unktrl(CMD_TAKEOFF,mode);
    pcVar13 = "Take off";
    iVar11 = 0x18;
LAB_001be666:
    menu_dynamic_add_label_valid(m,pcVar13,uVar3,iVar11,pcVar6,MN_ROW_VALID);
  }
  else {
    _Var2 = object_is_equipped(player->body,obj);
    if ((!_Var2) && (_Var2 = obj_can_wear(obj), _Var2)) {
      uVar3 = cmd_lookup_key_unktrl(CMD_WIELD,mode);
      pcVar13 = "Equip";
      iVar11 = 0x19;
      goto LAB_001be666;
    }
  }
  _Var2 = object_is_carried(player,obj);
  if (_Var2) {
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    _Var2 = square_isshop(cave,grid);
    if (_Var2) {
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      psVar7 = square(cave,grid_00);
      if (psVar7->feat != '\x0e') {
        _Var4 = store_will_buy_tester(obj);
        if (_Var4) {
          uVar3 = cmd_lookup_key_unktrl(CMD_DROP,mode);
          pcVar13 = "Sell";
          iVar11 = 0x1a;
          mVar12 = MN_ROW_VALID;
          goto LAB_001be732;
        }
        goto LAB_001be7db;
      }
      uVar3 = cmd_lookup_key_unktrl(CMD_DROP,mode);
      menu_dynamic_add_label_valid(m,"Drop",uVar3,0x1a,pcVar6,MN_ROW_VALID);
      bVar1 = obj->number;
    }
    else {
      uVar3 = cmd_lookup_key_unktrl(CMD_DROP,mode);
      menu_dynamic_add_label_valid(m,"Drop",uVar3,0x1a,pcVar6,MN_ROW_VALID);
      bVar1 = obj->number;
    }
    if (1 < bVar1) {
      menu_dynamic_add_label(m,"Drop All",(_Var4 == false) * '\x03' + 'A',0x45b,pcVar6);
    }
  }
  else {
    _Var4 = inven_carry_okay(obj);
    uVar3 = cmd_lookup_key_unktrl(CMD_PICKUP,mode);
    pcVar13 = "Pick up";
    iVar11 = 0x29;
    mVar12 = (menu_row_validity_t)_Var4;
LAB_001be732:
    menu_dynamic_add_label_valid(m,pcVar13,uVar3,iVar11,pcVar6,mVar12);
  }
LAB_001be7db:
  _Var4 = obj_can_throw(obj);
  if (_Var4) {
    uVar3 = cmd_lookup_key_unktrl(CMD_THROW,mode);
    menu_dynamic_add_label_valid(m,"Throw",uVar3,0x28,pcVar6,MN_ROW_VALID);
  }
  uVar3 = cmd_lookup_key_unktrl(CMD_INSCRIBE,mode);
  menu_dynamic_add_label_valid(m,"Inscribe",uVar3,0x15,pcVar6,MN_ROW_VALID);
  _Var4 = obj_has_inscrip(obj);
  if (_Var4) {
    uVar3 = cmd_lookup_key_unktrl(CMD_UNINSCRIBE,mode);
    menu_dynamic_add_label_valid(m,"Uninscribe",uVar3,0x16,pcVar6,MN_ROW_VALID);
  }
  uVar3 = cmd_lookup_key_unktrl(CMD_IGNORE,mode);
  _Var4 = object_is_ignored(obj);
  pcVar13 = "Ignore";
  if (_Var4) {
    pcVar13 = "Unignore";
  }
  menu_dynamic_add_label_valid(m,pcVar13,uVar3,0x2b,pcVar6,MN_ROW_VALID);
  sVar8 = menu_dynamic_longest_entry(m);
  iVar11 = (int)sVar8;
  local_b8.width = iVar11 + L'\x05';
  local_b8.col = (Term->wid - iVar11) + L'\xfffffffa';
  local_b8.row = L'\x01';
  local_b8.page_rows = m->count;
  msg_flag = false;
  screen_save();
  ptVar9 = object_info(obj,OINFO_NONE);
  object_desc(local_a8,0x78,obj,0x43,player);
  pcVar13 = format("%s");
  textui_textblock_place(ptVar9,(region_conflict)(ZEXT416(-iVar11 - 7U) << 0x40),pcVar13);
  textblock_free(ptVar9);
  menu_layout(m,(region *)&local_b8);
  region_erase_bordered(&local_b8);
  pcVar13 = format("(Enter to select, ESC) Command for %s:");
  prt(pcVar13,L'\0',L'\0');
  cVar5 = menu_dynamic_select(m);
  menu_dynamic_free(m);
  string_free(pcVar6);
  screen_load();
  uVar3 = cmd_lookup_key(cVar5,mode);
  if (0x11 < cVar5 - CMD_TAKEOFF) {
    if ((int)cVar5 < 0x2b) {
      if (1 < cVar5 - CMD_INSCRIBE) {
        if (cVar5 == ~CMD_NULL) {
          return L'\x03';
        }
LAB_001bec27:
        bell();
        return L'\x01';
      }
    }
    else if (cVar5 != CMD_IGNORE) {
      if (cVar5 == 0x45b) {
        grid_03.x = (player->grid).x;
        grid_03.y = (player->grid).y;
        _Var4 = square_isshop(cave,grid_03);
        cVar5 = CMD_DROP;
        if (_Var4) {
          cVar5 = CMD_STASH;
        }
        cmdq_push(cVar5);
        pcVar10 = cmdq_peek();
        cmd_set_arg_item(pcVar10,"item",obj);
        pcVar10 = cmdq_peek();
        cmd_set_arg_number(pcVar10,"quantity",(uint)obj->number);
        return L'\x01';
      }
      if (cVar5 == 0x45a) {
        ptVar9 = object_info(obj,OINFO_NONE);
        object_desc(local_a8,0x78,obj,0x43,player);
        pcVar6 = format("%s");
        textui_textblock_show(ptVar9,(region_conflict)(ZEXT416(-iVar11 - 7U) << 0x40),pcVar6);
        textblock_free(ptVar9);
        return L'\x02';
      }
      goto LAB_001bec27;
    }
  }
  _Var4 = key_confirm_command(uVar3);
  if (!_Var4) {
    return L'\x01';
  }
  _Var4 = get_item_allow(obj,uVar3,cVar5,false);
  if (!_Var4) {
    return L'\x01';
  }
  if ((int)cVar5 < 0x1d) {
    if (cVar5 == CMD_BROWSE_SPELL) {
      textui_book_browse(obj);
      return L'\x02';
    }
    if (cVar5 != CMD_STUDY) {
LAB_001beb07:
      cmdq_push(cVar5);
      pcVar10 = cmdq_peek();
      cmd_set_arg_item(pcVar10,"item",obj);
      if (cVar5 != CMD_DROP) {
        return L'\x01';
      }
      grid_01.x = (player->grid).x;
      grid_01.y = (player->grid).y;
      _Var4 = square_isshop(cave,grid_01);
      if (!_Var4) {
        return L'\x01';
      }
      pcVar10 = cmdq_peek();
      grid_02.x = (player->grid).x;
      grid_02.y = (player->grid).y;
      psVar7 = square(cave,grid_02);
      if (psVar7->feat == '\x0e') {
        pcVar10->code = CMD_STASH;
        return L'\x01';
      }
      pcVar10->code = CMD_SELL;
      return L'\x01';
    }
    cmdq_push(CMD_STUDY);
    pcVar10 = cmdq_peek();
    pcVar6 = "item";
  }
  else {
    if (cVar5 != CMD_CAST) {
      if (cVar5 == CMD_IGNORE) {
        textui_cmd_ignore_menu(obj);
        return L'\x01';
      }
      goto LAB_001beb07;
    }
    _Var4 = obj_can_cast_from(obj);
    if (!_Var4) {
      return L'\x01';
    }
    cmdq_push(CMD_CAST);
    pcVar10 = cmdq_peek();
    pcVar6 = "book";
  }
  cmd_set_arg_item(pcVar10,pcVar6,obj);
  return L'\x01';
}

Assistant:

int context_menu_object(struct object *obj)
{
	struct menu *m;
	region r;
	int selected;
	char *labels;
	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	bool allowed = true;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;
	unsigned char cmdkey;

	m = menu_dynamic_new();
	if (!m || !obj)
		return 0;

	object_desc(header, sizeof(header), obj, ODESC_PREFIX | ODESC_BASE,
		player);

	labels = string_make(lower_case);
	m->selections = labels;

	/* 'I' is used for inspect in both keymaps. */
	menu_dynamic_add_label(m, "Inspect", 'I', MENU_VALUE_INSPECT, labels);

	if (obj_can_browse(obj)) {
		if (obj_can_cast_from(obj) && player_can_cast(player, false))
			ADD_LABEL("Cast", CMD_CAST, MN_ROW_VALID);

		if (obj_can_study(obj) && player_can_study(player, false))
			ADD_LABEL("Study", CMD_STUDY, MN_ROW_VALID);

		if (player_can_read(player, false))
			ADD_LABEL("Browse", CMD_BROWSE_SPELL, MN_ROW_VALID);
	} else if (obj_is_useable(obj)) {
		if (tval_is_wand(obj)) {
			menu_row_validity_t valid = (obj_has_charges(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Aim", CMD_USE_WAND, valid);
		} else if (tval_is_rod(obj)) {
			menu_row_validity_t valid = (obj_can_zap(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Zap", CMD_USE_ROD, valid);
		} else if (tval_is_staff(obj)) {
			menu_row_validity_t valid = (obj_has_charges(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Use", CMD_USE_STAFF, valid);
		} else if (tval_is_scroll(obj)) {
			menu_row_validity_t valid = (player_can_read(player, false)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Read", CMD_READ_SCROLL, valid);
		} else if (tval_is_potion(obj)) {
			ADD_LABEL("Quaff", CMD_QUAFF, MN_ROW_VALID);
		} else if (tval_is_edible(obj)) {
			ADD_LABEL("Eat", CMD_EAT, MN_ROW_VALID);
		} else if (obj_is_activatable(obj)) {
			menu_row_validity_t valid = (object_is_equipped(player->body, obj)
										 && obj_can_activate(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Activate", CMD_ACTIVATE, valid);
		} else if (obj_can_fire(obj)) {
			ADD_LABEL("Fire", CMD_FIRE, MN_ROW_VALID);
		} else {
			ADD_LABEL("Use", CMD_USE, MN_ROW_VALID);
		}
	}

	if (obj_can_refill(obj))
		ADD_LABEL("Refill", CMD_REFILL, MN_ROW_VALID);

	if (object_is_equipped(player->body, obj) && obj_can_takeoff(obj)) {
		ADD_LABEL("Take off", CMD_TAKEOFF, MN_ROW_VALID);
	} else if (!object_is_equipped(player->body, obj) && obj_can_wear(obj)) {
		ADD_LABEL("Equip", CMD_WIELD, MN_ROW_VALID);
	}

	if (object_is_carried(player, obj)) {
		if (!square_isshop(cave, player->grid)) {
			ADD_LABEL("Drop", CMD_DROP, MN_ROW_VALID);

			if (obj->number > 1) {
				/* 'D' is used for ignore in rogue keymap, so swap letters. */
				cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'D' : 'A';
				menu_dynamic_add_label(m, "Drop All", cmdkey,
									   MENU_VALUE_DROP_ALL, labels);
			}
		} else if (square(cave, player->grid)->feat == FEAT_HOME) {
			ADD_LABEL("Drop", CMD_DROP, MN_ROW_VALID);

			if (obj->number > 1) {
				/* 'D' is used for ignore in rogue keymap, so swap letters. */
				cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'D' : 'A';
				menu_dynamic_add_label(m, "Drop All", cmdkey,
									   MENU_VALUE_DROP_ALL, labels);
			}
		} else if (store_will_buy_tester(obj)) {
			ADD_LABEL("Sell", CMD_DROP, MN_ROW_VALID);
		}
	} else {
		menu_row_validity_t valid = (inven_carry_okay(obj)) ?
			MN_ROW_VALID : MN_ROW_INVALID;
		ADD_LABEL("Pick up", CMD_PICKUP, valid);
	}

	if (obj_can_throw(obj)) {
		ADD_LABEL("Throw", CMD_THROW, MN_ROW_VALID);
	}

	ADD_LABEL("Inscribe", CMD_INSCRIBE, MN_ROW_VALID);

	if (obj_has_inscrip(obj))
		ADD_LABEL("Uninscribe", CMD_UNINSCRIBE, MN_ROW_VALID);

	ADD_LABEL( (object_is_ignored(obj) ? "Unignore" : "Ignore"), CMD_IGNORE,
			   MN_ROW_VALID);

	/* work out display region */
	r.width = (int)menu_dynamic_longest_entry(m) + 3 + 2; /* +3 for tag,
														   * 2 for pad */
	r.col = Term->wid - r.width - 1;
	r.row = 1;
	r.page_rows = m->count;

	area.width = -(r.width + 2);

	/* Hack -- no flush needed */
	msg_flag = false;
	screen_save();

	/* Display info */
	tb = object_info(obj, OINFO_NONE);
	object_desc(header, sizeof(header), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	textui_textblock_place(tb, area, format("%s", header));
	textblock_free(tb);

	menu_layout(m, &r);
	region_erase_bordered(&r);

	prt(format("(Enter to select, ESC) Command for %s:", header), 0, 0);
	selected = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	cmdkey = cmd_lookup_key(selected, mode);

	switch (selected) {
		case -1:
			/* User cancelled the menu. */
			return 3;

		case MENU_VALUE_INSPECT:
			/* copied from textui_obj_examine */
			/* Display info */
			tb = object_info(obj, OINFO_NONE);
			object_desc(header, sizeof(header), obj,
				ODESC_PREFIX | ODESC_FULL, player);

			textui_textblock_show(tb, area, format("%s", header));
			textblock_free(tb);
			return 2;

		case MENU_VALUE_DROP_ALL:
			/* Drop entire stack without confirmation. */
			if (square_isshop(cave, player->grid))
				cmdq_push(CMD_STASH);
			else
				cmdq_push(CMD_DROP);
			cmd_set_arg_item(cmdq_peek(), "item", obj);
			cmd_set_arg_number(cmdq_peek(), "quantity", obj->number);
			return 1;

		case CMD_BROWSE_SPELL:
		case CMD_STUDY:
		case CMD_CAST:
		case CMD_IGNORE:
		case CMD_WIELD:
		case CMD_TAKEOFF:
		case CMD_INSCRIBE:
		case CMD_UNINSCRIBE:
		case CMD_PICKUP:
		case CMD_DROP:
		case CMD_REFILL:
		case CMD_THROW:
		case CMD_USE_WAND:
		case CMD_USE_ROD:
		case CMD_USE_STAFF:
		case CMD_READ_SCROLL:
		case CMD_QUAFF:
		case CMD_EAT:
		case CMD_ACTIVATE:
		case CMD_FIRE:
		case CMD_USE:
			/* Check for inscriptions that trigger confirmation. */
			allowed = key_confirm_command(cmdkey) &&
				get_item_allow(obj, cmdkey, selected, false);
			break;
		default:
			/* Invalid command; prevent anything from happening. */
			bell();
			allowed = false;
			break;
	}

	if (!allowed)
		return 1;

	if (selected == CMD_IGNORE) {
		/* ignore or unignore the item */
		textui_cmd_ignore_menu(obj);
	} else if (selected == CMD_BROWSE_SPELL) {
		/* browse a spellbook */
		/* copied from textui_spell_browse */
		textui_book_browse(obj);
		return 2;
	} else if (selected == CMD_STUDY) {
		cmdq_push(CMD_STUDY);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
	} else if (selected == CMD_CAST) {
		if (obj_can_cast_from(obj)) {
			cmdq_push(CMD_CAST);
			cmd_set_arg_item(cmdq_peek(), "book", obj);
		}
	} else {
		cmdq_push(selected);
		cmd_set_arg_item(cmdq_peek(), "item", obj);

		/* If we're in a store, change the "drop" command to "stash". */
		if (selected == CMD_DROP &&
			square_isshop(cave, player->grid)) {
			struct command *gc = cmdq_peek();
			if (square(cave, player->grid)->feat == FEAT_HOME)
				gc->code = CMD_STASH;
			else
				gc->code = CMD_SELL;
		}
	}

	return 1;
}